

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O3

void __thiscall JUnitTestOutput::resetTestGroupResult(JUnitTestOutput *this)

{
  JUnitTestCaseResultNode *pJVar1;
  JUnitTestOutputImpl *pJVar2;
  JUnitTestCaseResultNode *this_00;
  SimpleString SStack_28;
  
  pJVar2 = this->impl_;
  (pJVar2->results_).testCount_ = 0;
  (pJVar2->results_).failureCount_ = 0;
  SimpleString::SimpleString(&SStack_28,"");
  SimpleString::operator=(&(this->impl_->results_).group_,&SStack_28);
  SimpleString::~SimpleString(&SStack_28);
  pJVar2 = this->impl_;
  this_00 = (pJVar2->results_).head_;
  if (this_00 != (JUnitTestCaseResultNode *)0x0) {
    do {
      pJVar1 = this_00->next_;
      if (this_00->failure_ != (TestFailure *)0x0) {
        (*this_00->failure_->_vptr_TestFailure[1])();
      }
      SimpleString::~SimpleString(&this_00->file_);
      SimpleString::~SimpleString(&this_00->name_);
      operator_delete(this_00,0x50);
      this_00 = pJVar1;
    } while (pJVar1 != (JUnitTestCaseResultNode *)0x0);
    pJVar2 = this->impl_;
  }
  (pJVar2->results_).head_ = (JUnitTestCaseResultNode *)0x0;
  (pJVar2->results_).tail_ = (JUnitTestCaseResultNode *)0x0;
  return;
}

Assistant:

void JUnitTestOutput::resetTestGroupResult()
{
    impl_->results_.testCount_ = 0;
    impl_->results_.failureCount_ = 0;
    impl_->results_.group_ = "";
    JUnitTestCaseResultNode* cur = impl_->results_.head_;
    while (cur) {
        JUnitTestCaseResultNode* tmp = cur->next_;
        delete cur->failure_;
        delete cur;
        cur = tmp;
    }
    impl_->results_.head_ = NULLPTR;
    impl_->results_.tail_ = NULLPTR;
}